

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
          (CommandLine<Catch::ConfigData> *this,
          offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          f)

{
  IArgFunction<Catch::ConfigData> *pIVar1;
  long *plVar2;
  IArgFunction<Catch::ConfigData> *pIVar3;
  
  plVar2 = (long *)operator_new(0x10);
  *plVar2 = (long)&PTR__IArgFunction_00166520;
  plVar2[1] = f;
  pIVar3 = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  pIVar3->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_00166520;
  pIVar3[1]._vptr_IArgFunction = (_func_int **)f;
  pIVar1 = (this->m_boundProcessName).functionObj;
  if (pIVar1 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar1->_vptr_IArgFunction[1])();
  }
  (this->m_boundProcessName).functionObj = pIVar3;
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

void bindProcessName( F f ) {
            m_boundProcessName = Detail::makeBoundField( f );
        }